

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ConcurrentAssertionStatementSyntax::setChild
          (ConcurrentAssertionStatementSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  NamedLabelSyntax *pNVar2;
  SyntaxNode *pSVar3;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar4;
  logic_error *this_00;
  Token TVar5;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index < 8) {
    switch(index) {
    case 0:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        pNVar2 = (NamedLabelSyntax *)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        pNVar2 = SyntaxNode::as<slang::syntax::NamedLabelSyntax>(pSVar3);
      }
      (this->super_StatementSyntax).label = pNVar2;
      break;
    case 1:
      pSVar3 = TokenOrSyntax::node(&child);
      pSVar4 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (pSVar3);
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar4->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_StatementSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar4->super_SyntaxListBase).childCount;
      sVar1 = (pSVar4->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar4->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_StatementSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 2:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->keyword).kind = TVar5.kind;
      (this->keyword).field_0x2 = TVar5._2_1_;
      (this->keyword).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->keyword).rawLen = TVar5.rawLen;
      (this->keyword).info = TVar5.info;
      break;
    case 3:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->propertyOrSequence).kind = TVar5.kind;
      (this->propertyOrSequence).field_0x2 = TVar5._2_1_;
      (this->propertyOrSequence).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->propertyOrSequence).rawLen = TVar5.rawLen;
      (this->propertyOrSequence).info = TVar5.info;
      break;
    case 4:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->openParen).kind = TVar5.kind;
      (this->openParen).field_0x2 = TVar5._2_1_;
      (this->openParen).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->openParen).rawLen = TVar5.rawLen;
      (this->openParen).info = TVar5.info;
      break;
    case 5:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::PropertySpecSyntax>(pSVar3);
      }
      not_null<slang::syntax::PropertySpecSyntax*>::
      not_null<slang::syntax::PropertySpecSyntax*,void>
                ((not_null<slang::syntax::PropertySpecSyntax*> *)&local_b8,
                 (PropertySpecSyntax **)&local_d8);
      (this->propertySpec).ptr = (PropertySpecSyntax *)local_b8._M_dataplus._M_p;
      break;
    case 6:
      TVar5 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
      (this->closeParen).kind = TVar5.kind;
      (this->closeParen).field_0x2 = TVar5._2_1_;
      (this->closeParen).numFlags = (NumericTokenFlags)TVar5.numFlags.raw;
      (this->closeParen).rawLen = TVar5.rawLen;
      (this->closeParen).info = TVar5.info;
      break;
    case 7:
      pSVar3 = TokenOrSyntax::node(&child);
      if (pSVar3 == (SyntaxNode *)0x0) {
        local_d8._M_dataplus._M_p = (pointer)0x0;
      }
      else {
        pSVar3 = TokenOrSyntax::node(&child);
        local_d8._M_dataplus._M_p =
             (pointer)SyntaxNode::as<slang::syntax::ActionBlockSyntax>(pSVar3);
      }
      not_null<slang::syntax::ActionBlockSyntax*>::not_null<slang::syntax::ActionBlockSyntax*,void>
                ((not_null<slang::syntax::ActionBlockSyntax*> *)&local_b8,
                 (ActionBlockSyntax **)&local_d8);
      (this->action).ptr = (ActionBlockSyntax *)local_b8._M_dataplus._M_p;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
             ,&local_d9);
  std::operator+(&local_58,&local_78,":");
  std::__cxx11::to_string(&local_98,0x9cf);
  std::operator+(&local_38,&local_58,&local_98);
  std::operator+(&local_d8,&local_38,": ");
  std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_b8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ConcurrentAssertionStatementSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 1: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 2: keyword = child.token(); return;
        case 3: propertyOrSequence = child.token(); return;
        case 4: openParen = child.token(); return;
        case 5: propertySpec = child.node() ? &child.node()->as<PropertySpecSyntax>() : nullptr; return;
        case 6: closeParen = child.token(); return;
        case 7: action = child.node() ? &child.node()->as<ActionBlockSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}